

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

__pid_t __thiscall
kj::Promise<kj::HttpClient::Response>::wait
          (Promise<kj::HttpClient::Response> *this,void *__stat_loc)

{
  Own<kj::_::PromiseNode> *node;
  Response *pRVar1;
  Exception *pEVar2;
  AsyncInputStream *in_RDX;
  Exception *exception_1;
  Exception *exception;
  Response *value;
  undefined1 local_1b8 [8];
  ExceptionOr<kj::HttpClient::Response> result;
  WaitScope *waitScope_local;
  Promise<kj::HttpClient::Response> *this_local;
  
  result.value.ptr.field_1.value.body.ptr = in_RDX;
  _::ExceptionOr<kj::HttpClient::Response>::ExceptionOr
            ((ExceptionOr<kj::HttpClient::Response> *)local_1b8);
  node = mv<kj::Own<kj::_::PromiseNode>>((Own<kj::_::PromiseNode> *)__stat_loc);
  _::waitImpl(node,(ExceptionOrValue *)local_1b8,
              (WaitScope *)result.value.ptr.field_1.value.body.ptr);
  pRVar1 = _::readMaybe<kj::HttpClient::Response>
                     ((Maybe<kj::HttpClient::Response> *)
                      ((long)&result.super_ExceptionOrValue.exception.ptr.field_1 + 0x150));
  if (pRVar1 != (Response *)0x0) {
    pEVar2 = _::readMaybe<kj::Exception>((Maybe<kj::Exception> *)local_1b8);
    if (pEVar2 != (Exception *)0x0) {
      pEVar2 = mv<kj::Exception>(pEVar2);
      throwRecoverableException(pEVar2,0);
    }
    pRVar1 = mv<kj::HttpClient::Response>(pRVar1);
    pRVar1 = _::returnMaybeVoid<kj::HttpClient::Response>(pRVar1);
    HttpClient::Response::Response((Response *)this,pRVar1);
    _::ExceptionOr<kj::HttpClient::Response>::~ExceptionOr
              ((ExceptionOr<kj::HttpClient::Response> *)local_1b8);
    return (__pid_t)this;
  }
  pEVar2 = _::readMaybe<kj::Exception>((Maybe<kj::Exception> *)local_1b8);
  if (pEVar2 != (Exception *)0x0) {
    pEVar2 = mv<kj::Exception>(pEVar2);
    throwFatalException(pEVar2,0);
  }
  _::unreachable();
}

Assistant:

T Promise<T>::wait(WaitScope& waitScope) {
  _::ExceptionOr<_::FixVoid<T>> result;

  _::waitImpl(kj::mv(node), result, waitScope);

  KJ_IF_MAYBE(value, result.value) {
    KJ_IF_MAYBE(exception, result.exception) {
      throwRecoverableException(kj::mv(*exception));
    }
    return _::returnMaybeVoid(kj::mv(*value));
  } else KJ_IF_MAYBE(exception, result.exception) {
    throwFatalException(kj::mv(*exception));
  } else {
    // Result contained neither a value nor an exception?
    KJ_UNREACHABLE;
  }